

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,Options *options,
               GeneratorContext *generator_context)

{
  FieldDescriptor *pFVar1;
  long lVar2;
  bool bVar3;
  int i;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  long lVar6;
  OneofDescriptor *pOVar7;
  ZeroCopyOutputStream *output_00;
  Options *options_00;
  FieldDescriptor *field;
  int i_1;
  char *text;
  long lVar8;
  int i_5;
  int i_2;
  string result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  undefined1 local_260 [24];
  pointer local_248;
  pointer pbStack_240;
  _Base_ptr local_238;
  string local_1f8;
  string fullname;
  string php_namespace;
  string filename_1;
  Printer printer;
  string base;
  string filename;
  string newname;
  string metadata_fullname;
  string metadata_filename;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x4b) == '\0') {
    FullClassName<google::protobuf::Descriptor>(&result,message,options);
    for (uVar5 = 0; uVar5 < result._M_string_length; uVar5 = uVar5 + 1) {
      if (result._M_dataplus._M_p[uVar5] == '\\') {
        result._M_dataplus._M_p[uVar5] = '/';
      }
    }
    std::operator+(&filename,&result,".php");
    std::__cxx11::string::~string((string *)&result);
    iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
    io::Printer::Printer(&printer,output,'^');
    GenerateHead(file,&printer);
    FilenameToClassname(&fullname,&filename);
    lVar6 = std::__cxx11::string::find_last_of((char *)&fullname,0x3cdbbf);
    if (lVar6 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&result,(ulong)&fullname);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"namespace ^name^;\n\n",(char (*) [5])0x3de831,&result);
      std::__cxx11::string::~string((string *)&result);
    }
    text = 
    "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
    ;
    if (options->is_descriptor != false) {
      text = 
      "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\GPBWire;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\InputStream;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
      ;
    }
    io::Printer::Print<>(&printer,text);
    io::Printer::Print<>(&printer,"/**\n");
    result.field_2._M_allocated_capacity = (size_type)&local_278;
    result.field_2._8_8_ = 0;
    local_278._M_local_buf[0] = '\0';
    local_268._M_p = local_260 + 8;
    local_260._0_8_ = 0;
    local_260[8] = '\0';
    local_248 = (pointer)0x0;
    pbStack_240 = (pointer)0x0;
    local_238 = (_Base_ptr)0x0;
    bVar3 = Descriptor::GetSourceLocation(message,(SourceLocation *)&result);
    if (bVar3) {
      GenerateDocCommentBodyForLocation(&printer,(SourceLocation *)&result,true,0);
    }
    SourceLocation::~SourceLocation((SourceLocation *)&result);
    FullClassName<google::protobuf::Descriptor>(&filename_1,message,options);
    EscapePhpdoc(&result,&filename_1);
    EscapePhpdoc(&php_namespace,(string *)(*(long *)(message + 8) + 0x20));
    io::Printer::Print<char[9],std::__cxx11::string,char[12],std::__cxx11::string>
              (&printer," * Generated from protobuf message <code>^messagename^</code>\n */\n",
               (char (*) [9])"fullname",&result,(char (*) [12])"messagename",&php_namespace);
    std::__cxx11::string::~string((string *)&php_namespace);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&filename_1);
    if (lVar6 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)&result,(ulong)&fullname);
      std::__cxx11::string::operator=((string *)&fullname,(string *)&result);
      std::__cxx11::string::~string((string *)&result);
    }
    base._M_dataplus._M_p = (pointer)&base.field_2;
    base._M_string_length = 0;
    base.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&base);
    io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
              (&printer,"class ^name^ extends ^base^\n{\n",(char (*) [5])"base",&base,
               (char (*) [5])0x3de831,&fullname);
    Indent(&printer);
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(message + 4); lVar6 = lVar6 + 1) {
      lVar2 = *(long *)(message + 0x28);
      pFVar1 = (FieldDescriptor *)(lVar2 + lVar8);
      if ((~*(byte *)(lVar2 + 1 + lVar8) & 0x60) == 0) {
        GenerateFieldDocComment(&printer,pFVar1,options,3);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&printer,"private $^name^;\n",(char (*) [5])0x3de831,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar2 + 8 + lVar8));
      }
      else {
        pOVar7 = FieldDescriptor::real_containing_oneof(pFVar1);
        if (pOVar7 == (OneofDescriptor *)0x0) {
          bVar3 = FieldDescriptor::has_presence(pFVar1);
          if (bVar3) {
            std::__cxx11::string::string((string *)&result,"null",(allocator *)&filename_1);
          }
          else {
            (anonymous_namespace)::DefaultForField_abi_cxx11_
                      (&result,(_anonymous_namespace_ *)pFVar1,field);
          }
          GenerateFieldDocComment(&printer,pFVar1,options,3);
          io::Printer::Print<char[5],std::__cxx11::string,char[14],std::__cxx11::string>
                    (&printer,"protected $^name^ = ^initial_value^;\n",(char (*) [5])0x3de831,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar2 + 8 + lVar8),(char (*) [14])"initial_value",&result);
          std::__cxx11::string::~string((string *)&result);
        }
      }
      lVar8 = lVar8 + 0x48;
    }
    lVar6 = 8;
    options_00 = (Options *)message;
    for (lVar8 = 0; lVar8 < *(int *)(message + 0x6c); lVar8 = lVar8 + 1) {
      options_00 = *(Options **)(*(long *)(message + 0x30) + lVar6);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"protected $^name^;\n",(char (*) [5])0x3de831,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options_00);
      lVar6 = lVar6 + 0x28;
    }
    io::Printer::Print<>(&printer,"\n");
    io::Printer::Print<>(&printer,"/**\n");
    io::Printer::Print<>(&printer," * Constructor.\n");
    io::Printer::Print<>(&printer," *\n");
    io::Printer::Print<>(&printer," * @param array $data {\n");
    io::Printer::Print<>(&printer," *     Optional. Data for populating the Message object.\n");
    io::Printer::Print<>(&printer," *\n");
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(message + 4); lVar6 = lVar6 + 1) {
      lVar2 = *(long *)(message + 0x28);
      pFVar1 = (FieldDescriptor *)(lVar8 + lVar2);
      (anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
                (&result,(_anonymous_namespace_ *)pFVar1,(FieldDescriptor *)options,options_00);
      io::Printer::Print<char[9],std::__cxx11::string,char[4],std::__cxx11::string>
                (&printer," *     @type ^php_type^ $^var^\n",(char (*) [9])"php_type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 (char (*) [4])0x3d9bfe,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar2 + 8 + lVar8));
      std::__cxx11::string::~string((string *)&result);
      result.field_2._M_allocated_capacity = (size_type)&local_278;
      result.field_2._8_8_ = 0;
      options_00 = (Options *)0x0;
      local_278._M_local_buf[0] = '\0';
      local_268._M_p = local_260 + 8;
      local_260._0_8_ = 0;
      local_260[8] = '\0';
      local_248 = (pointer)0x0;
      pbStack_240 = (pointer)0x0;
      local_238 = (_Base_ptr)0x0;
      bVar3 = FieldDescriptor::GetSourceLocation(pFVar1,(SourceLocation *)&result);
      if (bVar3) {
        options_00 = (Options *)0xa;
        GenerateDocCommentBodyForLocation(&printer,(SourceLocation *)&result,false,10);
      }
      SourceLocation::~SourceLocation((SourceLocation *)&result);
      lVar8 = lVar8 + 0x48;
    }
    io::Printer::Print<>(&printer," * }\n");
    io::Printer::Print<>(&printer," */\n");
    io::Printer::Print<>(&printer,"public function __construct($data = NULL) {\n");
    Indent(&printer);
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              (&metadata_filename,(_anonymous_namespace_ *)file,(FileDescriptor *)options,options_00
              );
    FilenameToClassname(&metadata_fullname,&metadata_filename);
    io::Printer::Print<char[9],std::__cxx11::string>
              (&printer,"\\^fullname^::initOnce();\n",(char (*) [9])"fullname",&metadata_fullname);
    io::Printer::Print<>(&printer,"parent::__construct($data);\n");
    Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n\n");
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(message + 4); lVar8 = lVar8 + 1) {
      GenerateFieldAccessor((FieldDescriptor *)(*(long *)(message + 0x28) + lVar6),options,&printer)
      ;
      lVar6 = lVar6 + 0x48;
    }
    lVar6 = 8;
    for (lVar8 = 0; lVar8 < *(int *)(message + 0x6c); lVar8 = lVar8 + 1) {
      lVar2 = *(long *)(message + 0x30);
      UnderscoresToCamelCase(&result,*(string **)(lVar2 + lVar6),true);
      io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                (&printer,
                 "/**\n * @return string\n */\npublic function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                 ,(char (*) [11])"camel_name",&result,(char (*) [5])0x3de831,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar2 + lVar6));
      std::__cxx11::string::~string((string *)&result);
      lVar6 = lVar6 + 0x28;
    }
    Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n\n");
    if (*(long *)(message + 0x18) != 0) {
      io::Printer::Print<>
                (&printer,
                 "// Adding a class alias for backwards compatibility with the previous class name.\n"
                );
      LegacyFullClassName<google::protobuf::Descriptor>(&result,message,options);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                (&printer,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
                 &fullname,(char (*) [4])"old",&result);
      std::__cxx11::string::~string((string *)&result);
      LegacyFullClassName<google::protobuf::Descriptor>(&result,message,options);
      for (uVar5 = 0; uVar5 < result._M_string_length; uVar5 = uVar5 + 1) {
        if (result._M_dataplus._M_p[uVar5] == '\\') {
          result._M_dataplus._M_p[uVar5] = '/';
        }
      }
      std::operator+(&filename_1,&result,".php");
      std::__cxx11::string::~string((string *)&result);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename_1);
      output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
      io::Printer::Printer((Printer *)&result,output_00,'^');
      GenerateHead(file,(Printer *)&result);
      RootPhpNamespace<google::protobuf::Descriptor>(&php_namespace,message,options);
      if (php_namespace._M_string_length != 0) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)&result,"namespace ^name^;\n\n",(char (*) [5])0x3de831,&php_namespace)
        ;
      }
      FullClassName<google::protobuf::Descriptor>(&newname,message,options);
      io::Printer::Print<>((Printer *)&result,"if (false) {\n");
      Indent((Printer *)&result);
      io::Printer::Print<>((Printer *)&result,"/**\n");
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)&result," * This class is deprecated. Use ^new^ instead.\n",
                 (char (*) [4])"new",&newname);
      io::Printer::Print<>((Printer *)&result," * @deprecated\n");
      io::Printer::Print<>((Printer *)&result," */\n");
      LegacyGeneratedClassName<google::protobuf::Descriptor>(&local_1f8,message);
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)&result,"class ^old^ {}\n",(char (*) [4])"old",&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      Outdent((Printer *)&result);
      io::Printer::Print<>((Printer *)&result,"}\n");
      GeneratedClassNameImpl<google::protobuf::Descriptor>(&local_1f8,message);
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)&result,"class_exists(^new^::class);\n",(char (*) [4])"new",&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      LegacyFullClassName<google::protobuf::Descriptor>(&local_1f8,message,options);
      io::Printer::Print<char[4],std::__cxx11::string,char[9],std::__cxx11::string>
                ((Printer *)&result,
                 "@trigger_error(\'^old^ is deprecated and will be removed in the next major release. Use ^fullname^ instead\', E_USER_DEPRECATED);\n\n"
                 ,(char (*) [4])"old",&local_1f8,(char (*) [9])"fullname",&newname);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&newname);
      std::__cxx11::string::~string((string *)&php_namespace);
      io::Printer::~Printer((Printer *)&result);
      if (output_00 != (ZeroCopyOutputStream *)0x0) {
        (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
      }
      std::__cxx11::string::~string((string *)&filename_1);
    }
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(message + 0x70); lVar8 = lVar8 + 1) {
      GenerateMessageFile(file,(Descriptor *)(*(long *)(message + 0x38) + lVar6),options,
                          generator_context);
      lVar6 = lVar6 + 0x88;
    }
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(message + 0x74); lVar8 = lVar8 + 1) {
      GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar6),options,
                       generator_context);
      lVar6 = lVar6 + 0x48;
    }
    std::__cxx11::string::~string((string *)&metadata_fullname);
    std::__cxx11::string::~string((string *)&metadata_filename);
    std::__cxx11::string::~string((string *)&base);
    std::__cxx11::string::~string((string *)&fullname);
    io::Printer::~Printer(&printer);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])();
    }
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         const Options& options,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(options, &printer);

  GenerateMessageDocComment(&printer, message, options);
  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  std::string base;

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      base = "\\Google\\Protobuf\\Internal\\AnyBase";
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      base = "\\Google\\Protobuf\\Internal\\TimestampBase";
      break;
    default:
      base = "\\Google\\Protobuf\\Internal\\Message";
      break;
  }

  printer.Print(
      "class ^name^ extends ^base^\n"
      "{\n",
      "base", base,
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, options);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, options);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename = GeneratedMetadataFileName(file, options);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n",
      "fullname", metadata_fullname);

  printer.Print(
      "parent::__construct($data);\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, options, &printer);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, options));
    LegacyGenerateClassFile(file, message, options, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), options,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), options, generator_context);
  }
}